

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_getLanguage_63(char *localeID,char *language,int32_t languageCapacity,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t i;
  UErrorCode *err_local;
  int32_t languageCapacity_local;
  char *language_local;
  char *localeID_local;
  
  if ((err != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*err), UVar1 == '\0')) {
    language_local = localeID;
    if (localeID == (char *)0x0) {
      language_local = uloc_getDefault_63();
    }
    iVar2 = ulocimp_getLanguage_63(language_local,language,languageCapacity,(char **)0x0);
    iVar2 = u_terminateChars_63(language,languageCapacity,iVar2,err);
    return iVar2;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getLanguage(const char*    localeID,
         char* language,
         int32_t languageCapacity,
         UErrorCode* err)
{
    /* uloc_getLanguage will return a 2 character iso-639 code if one exists. *CWB*/
    int32_t i=0;

    if (err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if(localeID==NULL) {
        localeID=uloc_getDefault();
    }

    i=ulocimp_getLanguage(localeID, language, languageCapacity, NULL);
    return u_terminateChars(language, languageCapacity, i, err);
}